

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int nni_ws_dialer_alloc(nng_stream_dialer **dp,nng_url *url)

{
  nng_stream_dialer *arg;
  int rv;
  nni_ws_dialer *d;
  nng_url *url_local;
  nng_stream_dialer **dp_local;
  
  arg = (nng_stream_dialer *)nni_zalloc(0x118);
  if (arg == (nng_stream_dialer *)0x0) {
    dp_local._4_4_ = NNG_ENOMEM;
  }
  else {
    nni_list_init_offset((nni_list *)&arg[3].sd_set,0);
    nni_list_init_offset((nni_list *)&arg[3].sd_close,0x38);
    nni_list_init_offset((nni_list *)&arg[3].sd_set,0);
    nni_mtx_init((nni_mtx *)&arg[1].sd_dial);
    nni_cv_init((nni_cv *)(arg + 2),(nni_mtx *)&arg[1].sd_dial);
    dp_local._4_4_ = nng_url_clone((nng_url **)(arg + 3),url);
    if (dp_local._4_4_ == NNG_OK) {
      dp_local._4_4_ = nni_http_client_init((nni_http_client **)&arg[1].sd_stop,url);
      if (dp_local._4_4_ == NNG_OK) {
        *(undefined1 *)((long)&arg[3].sd_get + 1) = 1;
        arg[4].sd_stop = (_func_void_void_ptr *)&Elf64_Ehdr_00100000;
        arg[4].sd_free = (_func_void_void_ptr *)0x100000;
        arg[4].sd_close = (_func_void_void_ptr *)0x10000;
        arg->sd_free = ws_dialer_free;
        arg->sd_close = ws_dialer_close;
        arg->sd_stop = ws_dialer_stop;
        arg->sd_dial = ws_dialer_dial;
        arg->sd_set = ws_dialer_set;
        arg->sd_get = ws_dialer_get;
        arg->sd_set_tls = ws_dialer_set_tls;
        arg->sd_get_tls = ws_dialer_get_tls;
        *dp = arg;
        dp_local._4_4_ = NNG_OK;
      }
      else {
        ws_dialer_free(arg);
      }
    }
    else {
      ws_dialer_free(arg);
    }
  }
  return dp_local._4_4_;
}

Assistant:

int
nni_ws_dialer_alloc(nng_stream_dialer **dp, const nng_url *url)
{
	nni_ws_dialer *d;
	int            rv;

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}
	NNI_LIST_INIT(&d->headers, ws_header, node);
	NNI_LIST_INIT(&d->wspend, nni_ws, node);
	NNI_LIST_INIT(&d->headers, ws_header, node);
	nni_mtx_init(&d->mtx);
	nni_cv_init(&d->cv, &d->mtx);

	if ((rv = nng_url_clone(&d->url, url)) != 0) {
		ws_dialer_free(d);
		return (rv);
	}

	if ((rv = nni_http_client_init(&d->client, url)) != 0) {
		ws_dialer_free(d);
		return (rv);
	}
	d->isstream = true;
	d->recvmax  = WS_DEF_RECVMAX;
	d->maxframe = WS_DEF_MAXRXFRAME;
	d->fragsize = WS_DEF_MAXTXFRAME;

	d->ops.sd_free    = ws_dialer_free;
	d->ops.sd_close   = ws_dialer_close;
	d->ops.sd_stop    = ws_dialer_stop;
	d->ops.sd_dial    = ws_dialer_dial;
	d->ops.sd_set     = ws_dialer_set;
	d->ops.sd_get     = ws_dialer_get;
	d->ops.sd_set_tls = ws_dialer_set_tls;
	d->ops.sd_get_tls = ws_dialer_get_tls;
	*dp               = (void *) d;
	return (0);
}